

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::initPrograms
          (TextureDerivateCase *this,SourceCollections *programCollection)

{
  undefined1 *b;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SurfaceType SVar8;
  DerivateFunc DVar9;
  DataType dataType;
  mapped_type *pmVar10;
  ProgramSources *pPVar11;
  ulong uVar12;
  Precision in_ECX;
  string *this_00;
  Precision precision;
  Vec4 dy;
  string fragmentSrc;
  string local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  string local_58;
  allocator<char> local_38 [16];
  
  SVar8 = (this->super_TriangleDerivateCase).m_definitions.surfaceType;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dataType = TYPE_FLOAT_VEC4;
  if (SVar8 == SURFACETYPE_FLOAT_FBO) {
    dataType = TYPE_UINT_VEC4;
  }
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"OUTPUT_TYPE",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dy);
  if (SVar8 == SURFACETYPE_FLOAT_FBO) {
    precision = PRECISION_HIGHP;
  }
  else {
    precision = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  glu::getPrecisionName(precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"OUTPUT_PREC",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dy);
  glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"PRECISION",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dy);
  glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"DATATYPE",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dy);
  getDerivateFuncName((this->super_TriangleDerivateCase).m_definitions.func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"FUNC",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dy,"SWIZZLE",(allocator<char> *)&fragmentSrc);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dy);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dy);
  if (SVar8 == SURFACETYPE_FLOAT_FBO) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dy,"CAST_TO_OUTPUT",(allocator<char> *)&fragmentSrc);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&fragmentParams,(key_type *)&dy);
    std::__cxx11::string::assign((char *)pmVar10);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dy,"CAST_TO_OUTPUT",(allocator<char> *)&fragmentSrc);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&fragmentParams,(key_type *)&dy);
    std::__cxx11::string::assign((char *)pmVar10);
  }
  std::__cxx11::string::~string((string *)&dy);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "#version 450\nlayout(location = 0) in highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nlayout(binding = 0, std140) uniform Scale { ${PRECISION} ${DATATYPE} u_scale; };\nlayout(binding = 1, std140) uniform Bias { ${PRECISION} ${DATATYPE} u_bias; };\nlayout(binding = 2) uniform ${PRECISION} sampler2D u_sampler;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,(allocator<char> *)&local_58);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&dy,&local_a8);
  tcu::StringTemplate::specialize(&fragmentSrc,(StringTemplate *)&dy,&fragmentParams);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&dy);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"vert",local_38);
  pPVar11 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_a8);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            (&local_58,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,in_ECX);
  glu::VertexSource::VertexSource((VertexSource *)&dy,&local_58);
  glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&dy);
  std::__cxx11::string::~string((string *)(dy.m_data + 2));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"frag",(allocator<char> *)&local_58);
  pPVar11 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_a8);
  glu::FragmentSource::FragmentSource((FragmentSource *)&dy,&fragmentSrc);
  glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&dy);
  std::__cxx11::string::~string((string *)(dy.m_data + 2));
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&fragmentSrc);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragmentParams._M_t);
  uVar12 = (ulong)(this->super_TriangleDerivateCase).m_definitions.precision;
  if (uVar12 < 3) {
    uVar1 = *(undefined4 *)(&DAT_009b3b58 + uVar12 * 4);
    uVar2 = *(undefined4 *)(&DAT_009b3b64 + uVar12 * 4);
    uVar3 = *(undefined4 *)(&DAT_009b3b70 + uVar12 * 4);
    uVar4 = *(undefined4 *)(&DAT_009b3b7c + uVar12 * 4);
    uVar5 = *(undefined4 *)(&DAT_009b3b88 + uVar12 * 4);
    uVar6 = *(undefined4 *)(&DAT_009b3b94 + uVar12 * 4);
    uVar7 = *(undefined4 *)(&DAT_009b3ba0 + uVar12 * 4);
    *(undefined4 *)&(this->super_TriangleDerivateCase).field_0x13c =
         *(undefined4 *)(&DAT_009b3b4c + uVar12 * 4);
    *(undefined4 *)&this->field_0x140 = uVar1;
    *(undefined4 *)&this->field_0x144 = uVar2;
    *(undefined4 *)&this->field_0x148 = uVar3;
    *(undefined4 *)&this->field_0x14c = uVar4;
    *(undefined4 *)&this->field_0x150 = uVar5;
    *(undefined4 *)&this->field_0x154 = uVar6;
    *(undefined4 *)&this->field_0x158 = uVar7;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,0.0);
  *(ulong *)(this->super_TriangleDerivateCase).m_values.coordMin.m_data =
       CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
  *(ulong *)((this->super_TriangleDerivateCase).m_values.coordMin.m_data + 2) =
       CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,1.0);
  *(ulong *)(this->super_TriangleDerivateCase).m_values.coordMax.m_data =
       CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
  *(ulong *)((this->super_TriangleDerivateCase).m_values.coordMax.m_data + 2) =
       CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,1.0);
    *(ulong *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
         CONCAT44(fragmentParams._M_t._M_impl._4_4_,fragmentParams._M_t._M_impl._0_4_);
    *(ulong *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
         CONCAT44(fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragmentParams,0.0);
    goto LAB_0059b23c;
  }
  b = &(this->super_TriangleDerivateCase).field_0x13c;
  tcu::operator-((tcu *)&dy,(Vector<float,_4> *)&this->field_0x14c,(Vector<float,_4> *)b);
  fragmentSrc._M_dataplus._M_p = (pointer)0x42c6000042c60000;
  fragmentSrc._M_string_length = 0xc246000042460000;
  tcu::operator/((tcu *)&fragmentParams,(Vector<float,_4> *)&dy,(Vector<float,_4> *)&fragmentSrc);
  tcu::operator-((tcu *)&fragmentSrc,(Vector<float,_4> *)&this->field_0x14c,(Vector<float,_4> *)b);
  local_a8._M_dataplus._M_p = (pointer)0x4305000043050000;
  local_a8._M_string_length = 0xc285000042850000;
  tcu::operator/((tcu *)&dy,(Vector<float,_4> *)&fragmentSrc,(Vector<float,_4> *)&local_a8);
  DVar9 = (this->super_TriangleDerivateCase).m_definitions.func;
  if (DVar9 < DERIVATE_DFDY) {
    this_00 = (string *)&fragmentParams;
LAB_0059b229:
    tcu::operator/((tcu *)&fragmentSrc,0.5,(Vector<float,_4> *)this_00);
    *(pointer *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
         fragmentSrc._M_dataplus._M_p;
    *(size_type *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
         fragmentSrc._M_string_length;
  }
  else {
    if (DVar9 - DERIVATE_DFDY < 3) {
      this_00 = (string *)&dy;
      goto LAB_0059b229;
    }
    if (DVar9 - DERIVATE_FWIDTH < 3) {
      tcu::abs<float,4>((tcu *)&local_58,(Vector<float,_4> *)&fragmentParams);
      tcu::abs<float,4>((tcu *)local_38,&dy);
      this_00 = &local_a8;
      tcu::operator+((tcu *)this_00,(Vector<float,_4> *)&local_58,(Vector<float,_4> *)local_38);
      goto LAB_0059b229;
    }
  }
  fragmentParams._M_t._M_impl._0_4_ = 0.0;
  fragmentParams._M_t._M_impl._4_4_ = 0.0;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0.0;
LAB_0059b23c:
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[0] =
       (float)fragmentParams._M_t._M_impl._0_4_;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[1] =
       (float)fragmentParams._M_t._M_impl._4_4_;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[2] =
       (float)fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[3] =
       (float)fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  return;
}

Assistant:

void TextureDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 450\n"
			"layout(location = 0) in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"layout(binding = 0, std140) uniform Scale { ${PRECISION} ${DATATYPE} u_scale; };\n"
			"layout(binding = 1, std140) uniform Bias { ${PRECISION} ${DATATYPE} u_bias; };\n"
			"layout(binding = 2) uniform ${PRECISION} sampler2D u_sampler;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);
		fragmentParams["SWIZZLE"]			= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */								   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
		}

		std::string fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
		programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
		programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_textureValues.texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_textureValues.texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_textureValues.texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_textureValues.texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_textureValues.texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_textureValues.texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Texture coordinates
	m_values.coordMin = tcu::Vec4(0.0f);
	m_values.coordMax = tcu::Vec4(1.0f);

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale		= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_textureValues.texValueMax - m_textureValues.texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_textureValues.texValueMax - m_textureValues.texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}